

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

PrepareResult __thiscall Statement::prepareStatement(Statement *this,string *st)

{
  bool bVar1;
  int iVar2;
  PrepareResult PVar3;
  string sStack_38;
  
  iVar2 = strncmp((st->_M_dataplus)._M_p,"insert",6);
  if (iVar2 == 0) {
    this->type = Insert;
    std::__cxx11::string::string((string *)&sStack_38,(string *)st);
    PVar3 = prepareInsert(this,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  else {
    bVar1 = std::operator==(st,"select");
    if (bVar1) {
      this->type = Select;
      PVar3 = PrepareSuccess;
    }
    else {
      PVar3 = PrepareUnrecognized;
    }
  }
  return PVar3;
}

Assistant:

PrepareResult Statement::prepareStatement(std::string st) {
	if (strncmp(st.c_str(), "insert", 6) == 0) {
		type = Insert;
		return prepareInsert(st);
	}
	if (st == "select") {
		type = Select;
		return PrepareSuccess;
	}

	return PrepareUnrecognized;
}